

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

FADFADSTATE * FADexp(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Fad<double> expaval;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_88;
  Fad<double> local_78;
  undefined1 local_58 [40];
  
  exp<double>((FadExpr<FadFuncExp<Fad<double>_>_> *)local_58,&x->val_);
  Fad<double>::Fad<FadFuncExp<Fad<double>>>
            (&local_78,(FadExpr<FadFuncExp<Fad<double>_>_> *)local_58);
  Fad<double>::~Fad((Fad<double> *)(local_58 + 8));
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_78);
  uVar1 = 0;
  uVar2 = (ulong)sz;
  if ((int)sz < 1) {
    uVar2 = uVar1;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    Fad<Fad<double>_>::dx((Fad<double> *)local_58,x,(int)uVar3);
    local_88.fadexpr_.left_ = &local_78;
    local_88.fadexpr_.right_ = (Fad<double> *)local_58;
    Fad<double>::operator=
              ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + uVar1),
               &local_88);
    Fad<double>::~Fad((Fad<double> *)local_58);
    uVar1 = uVar1 + 0x20;
  }
  Fad<double>::~Fad(&local_78);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADexp(FADFADSTATE x)
{
    Fad<STATE> expaval = exp(x.val());
    int sz = x.size();
    FADFADSTATE expa(sz,expaval);
    for (int i=0; i<sz; i++) {
        expa.fastAccessDx(i) = expaval*x.dx(i);
    }
    return expa;
}